

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffie-hellman.c
# Opt level: O0

dh_ctx * dh_setup_gex(mp_int *pval,mp_int *gval)

{
  dh_ctx *ctx_00;
  mp_int *pmVar1;
  dh_ctx *ctx;
  mp_int *gval_local;
  mp_int *pval_local;
  
  ctx_00 = (dh_ctx *)safemalloc(1,0x28,0);
  pmVar1 = mp_copy(pval);
  ctx_00->p = pmVar1;
  pmVar1 = mp_copy(gval);
  ctx_00->g = pmVar1;
  dh_init(ctx_00);
  return ctx_00;
}

Assistant:

dh_ctx *dh_setup_gex(mp_int *pval, mp_int *gval)
{
    dh_ctx *ctx = snew(dh_ctx);
    ctx->p = mp_copy(pval);
    ctx->g = mp_copy(gval);
    dh_init(ctx);
    return ctx;
}